

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O0

shared_ptr<QSslContext> __thiscall
QTlsPrivate::TlsCryptographOpenSSL::sslContext(TlsCryptographOpenSSL *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QSslContext> *in_RSI;
  element_type *in_RDI;
  shared_ptr<QSslContext> sVar1;
  
  std::shared_ptr<QSslContext>::shared_ptr(in_RSI,(shared_ptr<QSslContext> *)in_RDI);
  sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<QSslContext>)sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QSslContext> TlsCryptographOpenSSL::sslContext() const
{
    return sslContextPointer;
}